

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

void __thiscall
llm_graph_input_k_shift::set_input(llm_graph_input_k_shift *this,llama_ubatch *ubatch)

{
  void *pvVar1;
  llama_kv_cache_unified *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->k_shift != (ggml_tensor *)0x0) {
    pvVar1 = this->k_shift->data;
    plVar2 = this->kv_self;
    lVar3 = 1;
    for (uVar4 = 0; uVar4 < plVar2->size; uVar4 = uVar4 + 1) {
      *(llama_pos *)((long)pvVar1 + uVar4 * 4) =
           (&((plVar2->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
              _M_impl.super__Vector_impl_data._M_start)->pos)[lVar3];
      lVar3 = lVar3 + 0x10;
    }
  }
  return;
}

Assistant:

void llm_graph_input_k_shift::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    if (k_shift) {
        assert(ggml_backend_buffer_is_host(k_shift->buffer));

        int32_t * data = (int32_t *) k_shift->data;

        for (uint32_t i = 0; i < kv_self->size; ++i) {
            data[i] = kv_self->cells[i].delta;
        }
    }
}